

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  long lVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ImWchar wchars [17];
  ImWchar local_38 [20];
  
  lVar3 = 0;
  ImTextStrFromUtf8(local_38,0x11,utf8_chars,(char *)0x0,(char **)0x0);
  do {
    if (local_38[lVar3] == 0) {
      return;
    }
    if (this->InputCharacters[0] == 0) {
      uVar2 = 0;
LAB_00171325:
      this->InputCharacters[uVar2 & 0xffffffff] = local_38[lVar3];
      this->InputCharacters[(uVar2 & 0xffffffff) + 1] = 0;
    }
    else {
      uVar2 = 0;
      do {
        lVar1 = uVar2 + 1;
        uVar2 = uVar2 + 1;
      } while (this->InputCharacters[lVar1] != 0);
      if ((int)uVar2 - 1U < 0xf) goto LAB_00171325;
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x11) {
      return;
    }
  } while( true );
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    // We can't pass more wchars than ImGuiIO::InputCharacters[] can hold so don't convert more
    const int wchars_buf_len = sizeof(ImGuiIO::InputCharacters) / sizeof(ImWchar);
    ImWchar wchars[wchars_buf_len];
    ImTextStrFromUtf8(wchars, wchars_buf_len, utf8_chars, NULL);
    for (int i = 0; i < wchars_buf_len && wchars[i] != 0; i++)
        AddInputCharacter(wchars[i]);
}